

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int ssl_get_with_curl(char *url,curlmembuf *buffer,char *username,char *password)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  undefined8 uVar4;
  size_t sVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  float fVar10;
  char local_ae8 [8];
  char curlErrBuf [256];
  uint local_9dc;
  CURLcode res;
  CURL *curl;
  int notFound;
  int experimentWithCompression;
  int isFtp;
  char *verify;
  char *tmpUrl;
  char local_9a8 [4];
  float version;
  char agentStr [1200];
  char errStr [1200];
  long verifyHost;
  long verifyPeer;
  char *password_local;
  char *username_local;
  curlmembuf *buffer_local;
  char *url_local;
  
  tmpUrl._4_4_ = 0;
  pcVar3 = strstr(url,"ftp://");
  bVar7 = pcVar3 != (char *)0x0;
  pcVar3 = strstr(url,".gz");
  bVar8 = false;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = strstr(url,".Z");
    bVar8 = false;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strstr(url,"?");
      bVar8 = pcVar3 == (char *)0x0;
    }
  }
  bVar9 = true;
  pcVar3 = strstr(url,".Z");
  if ((pcVar3 == (char *)0x0) || (bVar7)) {
    uVar4 = curl_easy_init();
    iVar1 = curl_easy_setopt(uVar4,0x40,1);
    if (iVar1 == 0) {
      curl_easy_setopt(uVar4,0x51,2);
      curl_easy_setopt(uVar4,0x29,(long)curl_verbose);
      curl_easy_setopt(uVar4,0x4e2b,curlToMemCallback);
      fVar10 = ffvers((float *)((long)&tmpUrl + 4));
      snprintf(local_9a8,0x4b0,"FITSIO/HEASARC/%-8.4f",(double)fVar10);
      curl_easy_setopt(uVar4,0x2722,local_9a8);
      buffer->memory = (char *)0x0;
      buffer->size = 0;
      curl_easy_setopt(uVar4,0x2711,buffer);
      curl_easy_setopt(uVar4,0x271a,local_ae8);
      local_ae8[0] = '\0';
      curl_easy_setopt(uVar4,0x2d,1);
      curl_easy_setopt(uVar4,0x2776,"");
      sVar5 = strlen(url);
      pcVar3 = (char *)malloc(sVar5 + 4);
      strcpy(pcVar3,url);
      if (show_fits_download_progress == 0) {
        curl_easy_setopt(uVar4,0x2b,1);
      }
      else {
        curl_easy_setopt(uVar4,0x4e58,curlProgressCallback);
        curl_easy_setopt(uVar4,0x2749,pcVar3);
        curl_easy_setopt(uVar4,0x2b,0);
      }
      if (bVar7) {
        curl_easy_setopt(uVar4,0x77,3);
        if (username != (char *)0x0) {
          curl_easy_setopt(uVar4,0x27bd,username);
        }
        if (password != (char *)0x0) {
          curl_easy_setopt(uVar4,0x27be,password);
        }
      }
      if (bVar8) {
        strcat(pcVar3,".gz");
      }
      curl_easy_setopt(uVar4,0x2712,pcVar3);
      uVar2 = curl_easy_perform(uVar4);
      if (((uVar2 == 0) || (uVar2 == 0x16)) || (uVar2 == 0x4e)) {
        if ((uVar2 == 0x16) || (uVar2 == 0x4e)) {
          if (!bVar8) {
            snprintf(agentStr + 0x4a8,0x4b0,"libcurl error: %d",(ulong)uVar2);
            ffpmsg(agentStr + 0x4a8);
            sVar5 = strlen(local_ae8);
            if (sVar5 != 0) {
              ffpmsg(local_ae8);
            }
            curl_easy_cleanup(uVar4);
            free(pcVar3);
            return 0x68;
          }
          if (bVar7) {
            strcpy(pcVar3,url);
            strcat(pcVar3,".Z");
            curl_easy_setopt(uVar4,0x2712,pcVar3);
            iVar1 = curl_easy_perform(uVar4);
            bVar9 = iVar1 != 0;
          }
          if (bVar9) {
            strcpy(pcVar3,url);
            curl_easy_setopt(uVar4,0x2712,pcVar3);
            uVar2 = curl_easy_perform(uVar4);
            if (uVar2 != 0) {
              snprintf(agentStr + 0x4a8,0x4b0,"libcurl error: %d",(ulong)uVar2);
              ffpmsg(agentStr + 0x4a8);
              sVar5 = strlen(local_ae8);
              if (sVar5 != 0) {
                ffpmsg(local_ae8);
              }
              curl_easy_cleanup(uVar4);
              free(pcVar3);
              return 0x68;
            }
          }
        }
      }
      else {
        pcVar6 = getenv("CFITSIO_VERIFY_HTTPS");
        if ((pcVar6 != (char *)0x0) && ((*pcVar6 == 'T' || (*pcVar6 == 't')))) {
          snprintf(agentStr + 0x4a8,0x4b0,"libcurl error: %d",(ulong)uVar2);
          ffpmsg(agentStr + 0x4a8);
          sVar5 = strlen(local_ae8);
          if (sVar5 != 0) {
            ffpmsg(local_ae8);
          }
          curl_easy_cleanup(uVar4);
          free(pcVar3);
          return 0x68;
        }
        curl_easy_setopt(uVar4,0x40,0);
        curl_easy_setopt(uVar4,0x51,0);
        local_9dc = curl_easy_perform(uVar4);
        if (local_9dc == 0) {
          fprintf(_stderr,"Warning: Unable to perform SSL verification on https transfer from: %s\n"
                  ,pcVar3);
        }
        else {
          if ((bVar7) && (bVar8)) {
            strcpy(pcVar3,url);
            strcat(pcVar3,".Z");
            curl_easy_setopt(uVar4,0x2712,pcVar3);
            local_9dc = curl_easy_perform(uVar4);
            if (local_9dc == 0) {
              fprintf(_stderr,
                      "Warning: Unable to perform SSL verification on https transfer from: %s\n",
                      pcVar3);
            }
            bVar9 = local_9dc != 0;
          }
          if ((bVar8) && (bVar9)) {
            strcpy(pcVar3,url);
            curl_easy_setopt(uVar4,0x2712,pcVar3);
            uVar2 = curl_easy_perform(uVar4);
            if (uVar2 != 0) {
              snprintf(agentStr + 0x4a8,0x4b0,"libcurl error: %d",(ulong)uVar2);
              ffpmsg(agentStr + 0x4a8);
              sVar5 = strlen(local_ae8);
              if (sVar5 != 0) {
                ffpmsg(local_ae8);
              }
              curl_easy_cleanup(uVar4);
              free(pcVar3);
              return 0x68;
            }
            fprintf(_stderr,
                    "Warning: Unable to perform SSL verification on https transfer from: %s\n",
                    pcVar3);
          }
          else if (bVar9) {
            snprintf(agentStr + 0x4a8,0x4b0,"libcurl error: %d",(ulong)local_9dc);
            ffpmsg(agentStr + 0x4a8);
            sVar5 = strlen(local_ae8);
            if (sVar5 != 0) {
              ffpmsg(local_ae8);
            }
            curl_easy_cleanup(uVar4);
            free(pcVar3);
            return 0x68;
          }
        }
      }
      strcpy(url,pcVar3);
      free(pcVar3);
      curl_easy_cleanup(uVar4);
      url_local._4_4_ = 0;
    }
    else {
      ffpmsg("ERROR: CFITSIO was built with a libcurl library that ");
      ffpmsg("does not have SSL support, and therefore can\'t perform https or ftps transfers.");
      url_local._4_4_ = 0x68;
    }
  }
  else {
    ffpmsg("x-compress .Z format not currently supported with curl https transfers");
    url_local._4_4_ = 0x68;
  }
  return url_local._4_4_;
}

Assistant:

int ssl_get_with_curl(char *url, curlmembuf* buffer, char* username,
                        char* password)
{
  /* These settings will force libcurl to perform host and peer authentication.
     If it fails, this routine will try again without authentication (unless
     user forbids this via CFITSIO_VERIFY_HTTPS environment variable).
  */
  long verifyPeer = 1;
  long verifyHost = 2;
  char errStr[MAXLEN];
  char agentStr[MAXLEN];
  float version=0.0;
  char *tmpUrl=0;
  char *verify=0;
  int isFtp = (strstr(url,"ftp://") != NULL);
  int experimentWithCompression = (!strstr(url,".gz") && !strstr(url,".Z")
                && !strstr(url,"?"));
  int notFound=1;
  #ifdef CFITSIO_HAVE_CURL
  CURL *curl=0;
  CURLcode res;
  char curlErrBuf[CURL_ERROR_SIZE];
  
  if (strstr(url,".Z") && !isFtp)
  {
     ffpmsg("x-compress .Z format not currently supported with curl https transfers");
     return(FILE_NOT_OPENED);
  }

  /* Will ASSUME curl_global_init has been called by this point.
     It is not thread-safe to call it here. */
  curl = curl_easy_init();
   
  res = curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, verifyPeer);
  if (res != CURLE_OK)
  {
     ffpmsg("ERROR: CFITSIO was built with a libcurl library that ");
     ffpmsg("does not have SSL support, and therefore can't perform https or ftps transfers.");
     return (FILE_NOT_OPENED);    
  }
  curl_easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, verifyHost);
  
  curl_easy_setopt(curl, CURLOPT_VERBOSE, (long)curl_verbose);
  curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, curlToMemCallback);
  snprintf(agentStr,MAXLEN,"FITSIO/HEASARC/%-8.4f",ffvers(&version)); 
  curl_easy_setopt(curl, CURLOPT_USERAGENT,agentStr);
  
  buffer->memory = 0; /* malloc/realloc will grow this in the callback function */
  buffer->size = 0;
  curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void *)buffer);
  curl_easy_setopt(curl, CURLOPT_ERRORBUFFER, curlErrBuf);
  curlErrBuf[0]=0;
  /* This is needed for easy_perform to return an error whenever http server
      returns an error >= 400, ie. if it can't find the requested file. */
  curl_easy_setopt(curl, CURLOPT_FAILONERROR,  1L);
  /* This turns on automatic decompression for all recognized types. */
  curl_easy_setopt(curl, CURLOPT_ENCODING, "");
  
  /* tmpUrl should be large enough to accomodate original url + ".gz" */
  tmpUrl = (char *)malloc(strlen(url)+4);
  strcpy(tmpUrl, url);
  if (show_fits_download_progress)
  {
     curl_easy_setopt(curl, CURLOPT_PROGRESSFUNCTION, curlProgressCallback);
     curl_easy_setopt(curl, CURLOPT_PROGRESSDATA, tmpUrl);
     curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0L);
  }
  else
     curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 1L);
  
  /* USESSL only necessary for ftps, though it may not hurt anything
     if it were also set for https. */
  if (isFtp)
  {
     curl_easy_setopt(curl, CURLOPT_USE_SSL, CURLUSESSL_ALL);
     if (username)
        curl_easy_setopt(curl, CURLOPT_USERNAME, username);
     if (password)
        curl_easy_setopt(curl, CURLOPT_PASSWORD, password);
  }
  
  /* Unless url already contains a .gz, .Z or '?' (probably from a cgi script),
     first try with .gz appended. */
  
  if (experimentWithCompression)
     strcat(tmpUrl, ".gz");

  /* First attempt: verification on */
  curl_easy_setopt(curl, CURLOPT_URL, tmpUrl);
  res = curl_easy_perform(curl);
  if (res != CURLE_OK && res != CURLE_HTTP_RETURNED_ERROR && 
                res != CURLE_REMOTE_FILE_NOT_FOUND)
  {
     /*   CURLE_HTTP_RETURNED_ERROR is what gets returned if HTTP server
        returns an error code >= 400. CURLE_REMOTE_FILE_NOT_FOUND may
        be returned by an ftp server. If these are not causing this error, 
        assume it is a verification issue. 
          Try again with verification removed, unless user disallowed it
        via environment variable. */
     verify = getenv("CFITSIO_VERIFY_HTTPS");
     if (verify)
     {
        if (verify[0] == 'T' || verify[0] == 't')
        {
           snprintf(errStr,MAXLEN,"libcurl error: %d",res);
           ffpmsg(errStr);
           if (strlen(curlErrBuf))
              ffpmsg(curlErrBuf);     
           curl_easy_cleanup(curl);  
           free(tmpUrl);
           return (FILE_NOT_OPENED);
        }
     }
     verifyPeer = 0;
     verifyHost = 0;
     curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, verifyPeer);
     curl_easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, verifyHost);
     /* Second attempt: no verification, .gz appended */
     res = curl_easy_perform(curl);
     if (res != CURLE_OK)
     {
        if (isFtp && experimentWithCompression)
        {
           strcpy(tmpUrl, url);
           strcat(tmpUrl, ".Z");
           curl_easy_setopt(curl, CURLOPT_URL, tmpUrl);
           /* For ftps, make another attempt with .Z */
           res = curl_easy_perform(curl);
           if (res == CURLE_OK)
           {
              /* Success, but should still warn */
              fprintf(stderr, "Warning: Unable to perform SSL verification on https transfer from: %s\n",
                   tmpUrl);
              notFound=0;          
           }
        }
          
        /* If we've been appending .gz or .Z, try a final time without. */
        if (experimentWithCompression && notFound)
        {
           strcpy(tmpUrl, url);
           curl_easy_setopt(curl, CURLOPT_URL, tmpUrl);
           /* attempt with no verification, no .gz or .Z appended */ 
           res = curl_easy_perform(curl);
           if (res != CURLE_OK)
           {
              snprintf(errStr,MAXLEN,"libcurl error: %d",res);
              ffpmsg(errStr);
              if (strlen(curlErrBuf))
                 ffpmsg(curlErrBuf);     
              curl_easy_cleanup(curl);  
              free(tmpUrl);
              return (FILE_NOT_OPENED);
           }
           else
              /* Success, but should still warn */
              fprintf(stderr, "Warning: Unable to perform SSL verification on https transfer from: %s\n",
                   tmpUrl);           
        }
        else if (notFound)
        {
           snprintf(errStr,MAXLEN,"libcurl error: %d",res);
           ffpmsg(errStr);
           if (strlen(curlErrBuf))
              ffpmsg(curlErrBuf);     
           curl_easy_cleanup(curl);  
           free(tmpUrl);
           return (FILE_NOT_OPENED);
        }        
     }
     else
        /* Success, but still issue warning */
        fprintf(stderr, "Warning: Unable to perform SSL verification on https transfer from: %s\n",
             tmpUrl);

  }
  else if (res == CURLE_HTTP_RETURNED_ERROR || res == CURLE_REMOTE_FILE_NOT_FOUND)
  {
     /* .gz extension failed and verification isn't the problem.  
         No need to relax peer/host checking */
     /* Unless url already contained a .gz, .Z or '?' (probably from a cgi script),
        try again with original url unappended (but first try .Z if this is ftps). */
     if (experimentWithCompression)
     {
        if (isFtp)
        {
           strcpy(tmpUrl, url);
           strcat(tmpUrl, ".Z");
           curl_easy_setopt(curl, CURLOPT_URL, tmpUrl); 
           res = curl_easy_perform(curl);
           if (res == CURLE_OK)
              notFound = 0;
        }
        if (notFound)
        {
           strcpy(tmpUrl, url);
           curl_easy_setopt(curl, CURLOPT_URL, tmpUrl); 
           res = curl_easy_perform(curl);
           if (res != CURLE_OK)
           {
              snprintf(errStr,MAXLEN,"libcurl error: %d",res);
              ffpmsg(errStr);
              if (strlen(curlErrBuf))
                 ffpmsg(curlErrBuf);     
              curl_easy_cleanup(curl);  
              free(tmpUrl);
              return (FILE_NOT_OPENED);
           }
        }
     }
     else
     {
        snprintf(errStr,MAXLEN,"libcurl error: %d",res);
        ffpmsg(errStr);
        if (strlen(curlErrBuf))
           ffpmsg(curlErrBuf);     
        curl_easy_cleanup(curl);  
        free(tmpUrl);
        return (FILE_NOT_OPENED);
     }
  }
  
  /* If we made it here, assume tmpUrl was successful. Calling routines
     must make sure url can hold up to 3 extra chars */
  strcpy(url, tmpUrl);
  
  free(tmpUrl);
  curl_easy_cleanup(curl);
  
  #else
   ffpmsg("ERROR: This CFITSIO build was not compiled with the libcurl library package ");
   ffpmsg("and therefore it cannot perform HTTPS or FTPS connections."); 
   return (FILE_NOT_OPENED);  
  
  #endif
  return 0;
}